

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O0

void YUY2ToUV422Row_AVX2(uint8_t *src_yuy2,uint8_t *dst_u,uint8_t *dst_v,int width)

{
  undefined1 (*pauVar1) [32];
  bool bVar2;
  int iVar3;
  long lVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 in_ZMM5 [64];
  int width_local;
  uint8_t *dst_v_local;
  uint8_t *dst_u_local;
  uint8_t *src_yuy2_local;
  
  auVar7 = vpcmpeqb_avx2(in_ZMM5._0_32_,in_ZMM5._0_32_);
  auVar7 = vpsrlw_avx2(auVar7,8);
  lVar4 = (long)dst_v - (long)dst_u;
  do {
    auVar5 = *(undefined1 (*) [32])src_yuy2;
    pauVar1 = (undefined1 (*) [32])((long)src_yuy2 + 0x20);
    src_yuy2 = (uint8_t *)((long)src_yuy2 + 0x40);
    auVar5 = vpsrlw_avx2(auVar5,8);
    auVar6 = vpsrlw_avx2(*pauVar1,8);
    auVar5 = vpackuswb_avx2(auVar5,auVar6);
    auVar6 = vpermq_avx2(auVar5,0xd8);
    auVar5 = vpand_avx2(auVar6,auVar7);
    auVar6 = vpsrlw_avx2(auVar6,8);
    auVar5 = vpackuswb_avx2(auVar5,auVar5);
    auVar6 = vpackuswb_avx2(auVar6,auVar6);
    auVar5 = vpermq_avx2(auVar5,0xd8);
    auVar6 = vpermq_avx2(auVar6,0xd8);
    *(undefined1 (*) [16])dst_u = auVar5._0_16_;
    *(undefined1 (*) [16])((long)dst_u + lVar4) = auVar6._0_16_;
    dst_u = (uint8_t *)((long)dst_u + 0x10);
    iVar3 = width + -0x20;
    bVar2 = 0x1f < width;
    width = iVar3;
  } while (iVar3 != 0 && bVar2);
  return;
}

Assistant:

void YUY2ToUV422Row_AVX2(const uint8_t* src_yuy2,
                         uint8_t* dst_u,
                         uint8_t* dst_v,
                         int width) {
  asm volatile(
      "vpcmpeqb    %%ymm5,%%ymm5,%%ymm5          \n"
      "vpsrlw      $0x8,%%ymm5,%%ymm5            \n"
      "sub         %1,%2                         \n"

      LABELALIGN
      "1:                                        \n"
      "vmovdqu     (%0),%%ymm0                   \n"
      "vmovdqu     0x20(%0),%%ymm1               \n"
      "lea         0x40(%0),%0                   \n"
      "vpsrlw      $0x8,%%ymm0,%%ymm0            \n"
      "vpsrlw      $0x8,%%ymm1,%%ymm1            \n"
      "vpackuswb   %%ymm1,%%ymm0,%%ymm0          \n"
      "vpermq      $0xd8,%%ymm0,%%ymm0           \n"
      "vpand       %%ymm5,%%ymm0,%%ymm1          \n"
      "vpsrlw      $0x8,%%ymm0,%%ymm0            \n"
      "vpackuswb   %%ymm1,%%ymm1,%%ymm1          \n"
      "vpackuswb   %%ymm0,%%ymm0,%%ymm0          \n"
      "vpermq      $0xd8,%%ymm1,%%ymm1           \n"
      "vpermq      $0xd8,%%ymm0,%%ymm0           \n"
      "vextractf128 $0x0,%%ymm1,(%1)             \n"
      "vextractf128 $0x0,%%ymm0,0x00(%1,%2,1)    \n"
      "lea         0x10(%1),%1                   \n"
      "sub         $0x20,%3                      \n"
      "jg          1b                            \n"
      "vzeroupper                                \n"
      : "+r"(src_yuy2),  // %0
        "+r"(dst_u),     // %1
        "+r"(dst_v),     // %2
        "+r"(width)      // %3
      :
      : "memory", "cc", "xmm0", "xmm1", "xmm5");
}